

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHParameters.cpp
# Opt level: O1

bool __thiscall DHParameters::deserialise(DHParameters *this,ByteString *serialised)

{
  size_t sVar1;
  unsigned_long uVar2;
  bool bVar3;
  ByteString dLen;
  ByteString dG;
  ByteString dP;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::chainDeserialise(&local_38,serialised);
  ByteString::chainDeserialise(&local_60,serialised);
  ByteString::chainDeserialise(&local_88,serialised);
  sVar1 = ByteString::size(&local_38);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_60);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_88);
      if (sVar1 != 0) {
        ByteString::operator=(&this->p,&local_38);
        ByteString::operator=(&this->g,&local_60);
        uVar2 = ByteString::long_val(&local_88);
        this->bitLen = uVar2;
        bVar3 = true;
        goto LAB_0012e89c;
      }
    }
  }
  bVar3 = false;
LAB_0012e89c:
  local_88._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_88.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool DHParameters::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dLen = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dLen.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setXBitLength(dLen.long_val());

	return true;
}